

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncUFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  int64_t iVar4;
  ulong uVar5;
  BasicType local_3c [3];
  double local_30;
  double val;
  Literal *value_local;
  Unary *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  val = (double)value;
  value_local = (Literal *)curr;
  curr_local = (Unary *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  local_30 = (double)::wasm::Literal::getFloat();
  uVar2 = std::isnan(local_30);
  if ((uVar2 & 1) != 0) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncUFloat of nan");
  }
  local_3c[2] = 2;
  bVar1 = Type::operator==((Type *)&(value_local->field_0).func.super_IString.str._M_str,
                           local_3c + 2);
  if (bVar1) {
    local_3c[1] = 4;
    bVar1 = Type::operator==(&value->type,local_3c + 1);
    if (bVar1) {
      iVar3 = wasm::Literal::reinterpreti32(value);
      uVar5 = ::wasm::isInRangeI32TruncU(iVar3);
      if ((uVar5 & 1) == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"i32.truncUFloat overflow");
      }
    }
    else {
      iVar4 = wasm::Literal::reinterpreti64(value);
      uVar5 = ::wasm::isInRangeI32TruncU(iVar4);
      if ((uVar5 & 1) == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"i32.truncUFloat overflow");
      }
    }
    wasm::Literal::Literal(__return_storage_ptr__,(uint32_t)(long)local_30);
  }
  else {
    local_3c[0] = f32;
    bVar1 = Type::operator==(&value->type,local_3c);
    if (bVar1) {
      iVar3 = wasm::Literal::reinterpreti32(value);
      uVar5 = ::wasm::isInRangeI64TruncU(iVar3);
      if ((uVar5 & 1) == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"i64.truncUFloat overflow");
      }
    }
    else {
      iVar4 = wasm::Literal::reinterpreti64(value);
      uVar5 = ::wasm::isInRangeI64TruncU(iVar4);
      if ((uVar5 & 1) == 0) {
        (*this->_vptr_ExpressionRunner[2])(this,"i64.truncUFloat overflow");
      }
    }
    wasm::Literal::Literal
              (__return_storage_ptr__,
               (long)local_30 | (long)(local_30 - 9.223372036854776e+18) & (long)local_30 >> 0x3f);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal truncUFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncUFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncU(value.reinterpreti32())) {
          trap("i32.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncU(value.reinterpreti64())) {
          trap("i32.truncUFloat overflow");
        }
      }
      return Literal(uint32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncU(value.reinterpreti32())) {
          trap("i64.truncUFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncU(value.reinterpreti64())) {
          trap("i64.truncUFloat overflow");
        }
      }
      return Literal(uint64_t(val));
    }
  }